

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_24fa3d::OSScapture::recordProc(OSScapture *this)

{
  FILE *pFVar1;
  ALuint AVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  char *pcVar6;
  ALCdevice *this_00;
  char *msg;
  pollfd local_58;
  ll_ringbuffer_data_pair vec;
  
  SetRTPriority();
  althrd_setname("alsoft-record");
  AVar2 = ALCdevice::frameSizeFromFmt((this->super_BackendBase).mDevice);
  do {
    while( true ) {
      if (((this->mKillNow)._M_base._M_i & 1U) != 0) {
        return 0;
      }
      local_58.events = 1;
      local_58.revents = 0;
      local_58.fd = this->mFd;
      iVar3 = poll(&local_58,1,1000);
      if (iVar3 < 0) break;
      if (iVar3 == 0) {
        if (1 < (int)gLogLevel) {
          fwrite("[ALSOFT] (WW) poll timeout\n",0x1b,1,(FILE *)gLogFile);
        }
      }
      else {
        RingBuffer::getWriteVector
                  ((this->mRing)._M_t.
                   super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                   super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                   super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl);
        if (vec.first.len != 0) {
          uVar4 = read(this->mFd,vec.first.buf,vec.first.len * AVar2);
          pFVar1 = gLogFile;
          if ((long)uVar4 < 0) {
            if ((int)gLogLevel < 1) {
              piVar5 = __errno_location();
            }
            else {
              piVar5 = __errno_location();
              pcVar6 = strerror(*piVar5);
              fprintf((FILE *)pFVar1,"[ALSOFT] (EE) read failed: %s\n",pcVar6);
            }
            this_00 = (this->super_BackendBase).mDevice;
            pcVar6 = strerror(*piVar5);
            msg = "Failed reading capture samples: %s";
            goto LAB_0015e139;
          }
          RingBuffer::writeAdvance
                    ((this->mRing)._M_t.
                     super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                     super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                     super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl,
                     (uVar4 & 0xffffffff) / (ulong)AVar2);
        }
      }
    }
    piVar5 = __errno_location();
    pFVar1 = gLogFile;
    iVar3 = *piVar5;
  } while ((iVar3 == 4) || (iVar3 == 0xb));
  if (0 < (int)gLogLevel) {
    pcVar6 = strerror(iVar3);
    fprintf((FILE *)pFVar1,"[ALSOFT] (EE) poll failed: %s\n",pcVar6);
    iVar3 = *piVar5;
  }
  this_00 = (this->super_BackendBase).mDevice;
  pcVar6 = strerror(iVar3);
  msg = "Failed to check capture samples: %s";
LAB_0015e139:
  ALCdevice::handleDisconnect(this_00,msg,pcVar6);
  return 0;
}

Assistant:

int OSScapture::recordProc()
{
    SetRTPriority();
    althrd_setname(RECORD_THREAD_NAME);

    const ALuint frame_size{mDevice->frameSizeFromFmt()};
    while(!mKillNow.load(std::memory_order_acquire))
    {
        pollfd pollitem{};
        pollitem.fd = mFd;
        pollitem.events = POLLIN;

        int sret{poll(&pollitem, 1, 1000)};
        if(sret < 0)
        {
            if(errno == EINTR || errno == EAGAIN)
                continue;
            ERR("poll failed: %s\n", strerror(errno));
            mDevice->handleDisconnect("Failed to check capture samples: %s", strerror(errno));
            break;
        }
        else if(sret == 0)
        {
            WARN("poll timeout\n");
            continue;
        }

        auto vec = mRing->getWriteVector();
        if(vec.first.len > 0)
        {
            ssize_t amt{read(mFd, vec.first.buf, vec.first.len*frame_size)};
            if(amt < 0)
            {
                ERR("read failed: %s\n", strerror(errno));
                mDevice->handleDisconnect("Failed reading capture samples: %s", strerror(errno));
                break;
            }
            mRing->writeAdvance(static_cast<ALuint>(amt)/frame_size);
        }
    }

    return 0;
}